

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash32.c
# Opt level: O3

hwaddr ppc_hash32_pteg_search
                 (PowerPCCPU_conflict3 *cpu,hwaddr pteg_off,_Bool secondary,target_ulong ptem,
                 ppc_hash_pte32_t *pte)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  
  iVar3 = 8;
  while( true ) {
    uVar1 = address_space_ldl_ppc64
                      ((cpu->env).uc,(cpu->parent_obj).as,
                       (ulong)*(ushort *)((long)(cpu->env).spr + 0xca) * 0x10000 + pteg_off,
                       (MemTxAttrs)0x1,(MemTxResult *)0x0);
    uVar2 = address_space_ldl_ppc64
                      ((cpu->env).uc,(cpu->parent_obj).as,
                       pteg_off + (ulong)*(ushort *)((long)(cpu->env).spr + 0xca) * 0x10000 + 4,
                       (MemTxAttrs)0x1,(MemTxResult *)0x0);
    if ((((int)uVar1 < 0) && (((uVar1 & 0x40) == 0) != secondary)) &&
       (((uVar1 ^ (uint)ptem) & 0x7fffffbf) == 0)) break;
    pteg_off = pteg_off + 8;
    iVar3 = iVar3 + -1;
    if (iVar3 == 0) {
      return 0xffffffffffffffff;
    }
  }
  pte->pte0 = uVar1;
  pte->pte1 = uVar2;
  return pteg_off;
}

Assistant:

static hwaddr ppc_hash32_pteg_search(PowerPCCPU *cpu, hwaddr pteg_off,
                                     bool secondary, target_ulong ptem,
                                     ppc_hash_pte32_t *pte)
{
    hwaddr pte_offset = pteg_off;
    target_ulong pte0, pte1;
    int i;

    for (i = 0; i < HPTES_PER_GROUP; i++) {
        pte0 = ppc_hash32_load_hpte0(cpu, pte_offset);
        /*
         * pte0 contains the valid bit and must be read before pte1,
         * otherwise we might see an old pte1 with a new valid bit and
         * thus an inconsistent hpte value
         */
        smp_rmb();
        pte1 = ppc_hash32_load_hpte1(cpu, pte_offset);

        if ((pte0 & HPTE32_V_VALID)
            && (secondary == !!(pte0 & HPTE32_V_SECONDARY))
            && HPTE32_V_COMPARE(pte0, ptem)) {
            pte->pte0 = pte0;
            pte->pte1 = pte1;
            return pte_offset;
        }

        pte_offset += HASH_PTE_SIZE_32;
    }

    return -1;
}